

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot.cpp
# Opt level: O3

bool ValidMonthDayCombo(int month,int day)

{
  byte bVar1;
  
  bVar1 = 1;
  if ((0x1b < day - 1U) && (month == 2 || 1 < day - 0x1dU)) {
    if ((uint)month < 0xd && day == 0x1f) {
      bVar1 = (byte)(0x15aa >> ((byte)month & 0x1f));
    }
    else {
      bVar1 = 0;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ValidMonthDayCombo(int month, int day)
{
    if(day >= 1 && day <= 28)
    {
        return true;
    }
    else if((day == 29 || day == 30) && month != 2)
    {
        return true;
    }
    else if(day == 31 && (month == 1 || month == 3 || month == 5 || month == 7 || month == 8 || month == 10 || month == 12))
    {
        return true;
    }
    else
    {
        return false;
    }
}